

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O0

FUNCTION_RETURN getModuleName(char *buffer)

{
  uint uVar1;
  int iVar2;
  FUNCTION_RETURN FVar3;
  ssize_t sVar4;
  int ch;
  pid_t pid;
  char pidStr [64];
  char proc_path [1024];
  char path [1024];
  FUNCTION_RETURN result;
  char *buffer_local;
  
  memset(proc_path + 0x3f8,0,0x400);
  uVar1 = getpid();
  sprintf((char *)&ch,"%d",(ulong)uVar1);
  strcpy(pidStr + 0x38,"/proc/");
  strcat(pidStr + 0x38,(char *)&ch);
  strcat(pidStr + 0x38,"/exe");
  sVar4 = readlink(pidStr + 0x38,proc_path + 0x3f8,0x3ff);
  iVar2 = (int)sVar4;
  if ((iVar2 < 0x401) && (-1 < iVar2)) {
    license::mstrlcpy(buffer,proc_path + 0x3f8,(long)(iVar2 + 1));
    path[0x3fc] = '\0';
    path[0x3fd] = '\0';
    path[0x3fe] = '\0';
    path[0x3ff] = '\0';
  }
  else {
    path[0x3fc] = '\x02';
    path[0x3fd] = '\0';
    path[0x3fe] = '\0';
    path[0x3ff] = '\0';
  }
  FVar3._0_1_ = path[0x3fc];
  FVar3._1_1_ = path[0x3fd];
  FVar3._2_1_ = path[0x3fe];
  FVar3._3_1_ = path[0x3ff];
  return FVar3;
}

Assistant:

FUNCTION_RETURN getModuleName(char buffer[MAX_PATH]) {
	FUNCTION_RETURN result;
	char path[MAX_PATH] = {0};
	char proc_path[MAX_PATH], pidStr[64];
	pid_t pid = getpid();
	sprintf(pidStr, "%d", pid);
	strcpy(proc_path, "/proc/");
	strcat(proc_path, pidStr);
	strcat(proc_path, "/exe");

	int ch = readlink(proc_path, path, MAX_PATH - 1);
	if (ch > MAX_PATH || ch < 0) {
		result = FUNC_RET_ERROR;
	} else {
		mstrlcpy(buffer, path, ch + 1);
		result = FUNC_RET_OK;
	}
	return result;
}